

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ap.c
# Opt level: O0

int open_config(AP_CTX *ctx)

{
  char *pcVar1;
  char *pcVar2;
  FILE *pFVar3;
  int *piVar4;
  char *pcVar5;
  int local_14;
  int rc;
  AP_CTX *ctx_local;
  
  local_14 = 0;
  pFVar3 = fopen(ctx->config_path,"rt");
  ctx->config_file = (FILE *)pFVar3;
  if (ctx->config_file == (FILE *)0x0) {
    pcVar1 = ctx->client_ip;
    pcVar2 = ctx->config_path;
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    ap_log(AP_LOG_LEVEL_ERROR,"(%s) Can not open configuration file \'%s\', error: \'%s\'\n",pcVar1,
           pcVar2,pcVar5);
    local_14 = 9;
  }
  return local_14;
}

Assistant:

static int open_config (AP_CTX *ctx)
{
	int		rc			= AP_NO_ERROR;
	
	ctx->config_file = fopen (ctx->config_path, "rt");
	if (ctx->config_file == NULL)
	{
		ap_error ("(%s) Can not open configuration file '%s', error: '%s'\n", ctx->client_ip, ctx->config_path, strerror (errno));
		rc = AP_ERROR_CONFIG_FILE;

		goto finish;
	}

finish:
	return rc;
}